

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
* __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
::insert(Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
         *this,pair<unsigned_long,_signed_char> *value)

{
  pointer pNVar1;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *pNVar2;
  size_t sVar3;
  size_t sVar4;
  Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *pNVar5;
  ulong uVar6;
  size_t *psVar7;
  pointer pNVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (value->second < (this->_value).second) {
    return (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
            *)0x0;
  }
  lVar11 = (long)(this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar11 != 0) {
    lVar12 = 1 - (lVar11 >> 4);
    do {
      pNVar5 = *(Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                 **)((long)&(this->_nodeRefs)._nodes.
                            super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].pNode + lVar11);
      if ((pNVar5 != (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                      *)0x0) &&
         (pNVar5 = insert(pNVar5,value),
         pNVar5 != (Node<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                    *)0x0)) {
        uVar13 = -lVar12;
        goto LAB_00df8f37;
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + -0x10;
    } while (lVar12 != 1);
  }
  pNVar5 = _Pool::Allocate(this->_pool,value);
  uVar13 = 0;
LAB_00df8f37:
  uVar6 = (pNVar5->_nodeRefs)._swapLevel;
  pNVar8 = (pNVar5->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)(pNVar5->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 4;
  pNVar1 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar6 < uVar9) {
    if (uVar13 < uVar6) {
      pNVar8[uVar6].width = pNVar8[uVar6].width + pNVar1[uVar13].width;
      uVar13 = uVar13 + 1;
    }
    uVar10 = (long)(this->_nodeRefs)._nodes.
                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4;
    if (uVar9 < uVar10) {
      uVar10 = uVar9;
    }
    lVar11 = uVar10 - uVar13;
    if (uVar13 <= uVar10 && lVar11 != 0) {
      uVar14 = uVar13 << 4 | 8;
      do {
        pNVar1 = (this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(long *)((long)&pNVar1->pNode + uVar14) =
             (*(long *)((long)&pNVar1->pNode + uVar14) - *(long *)((long)&pNVar8->pNode + uVar14)) +
             1;
        pNVar2 = pNVar1[uVar6].pNode;
        sVar3 = pNVar1[uVar6].width;
        sVar4 = pNVar8[uVar6].width;
        pNVar1[uVar6].pNode = pNVar8[uVar6].pNode;
        pNVar1[uVar6].width = sVar4;
        pNVar8 = (pNVar5->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (pNVar5->_nodeRefs)._swapLevel;
        pNVar8->pNode = pNVar2;
        pNVar8->width = sVar3;
        uVar6 = (pNVar5->_nodeRefs)._swapLevel + 1;
        (pNVar5->_nodeRefs)._swapLevel = uVar6;
        pNVar8 = (pNVar5->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar9 = (long)(pNVar5->_nodeRefs)._nodes.
                      super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 4;
        if (uVar6 < uVar9) {
          pNVar8[uVar6].width =
               *(size_t *)
                ((long)&((this->_nodeRefs)._nodes.
                         super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->pNode + uVar14);
        }
        uVar14 = uVar14 + 0x10;
        lVar11 = lVar11 + -1;
        uVar13 = uVar10;
      } while (lVar11 != 0);
    }
    if (uVar9 <= uVar6) {
      pNVar8 = (this->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(this->_nodeRefs)._nodes.
                    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 4;
      lVar11 = uVar6 - uVar13;
      pNVar5 = this;
      if (uVar13 <= uVar6 && lVar11 != 0) {
        psVar7 = &pNVar8[uVar13].width;
        do {
          *psVar7 = *psVar7 + 1;
          psVar7 = psVar7 + 2;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
    }
  }
  else {
    uVar13 = (long)(this->_nodeRefs)._nodes.
                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4;
    lVar11 = uVar13 - uVar9;
    pNVar5 = this;
    if (uVar9 <= uVar13 && lVar11 != 0) {
      psVar7 = &pNVar1[uVar9].width;
      do {
        *psVar7 = *psVar7 + 1;
        psVar7 = psVar7 + 2;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
  }
  return pNVar5;
}

Assistant:

inline bool operator()(const T &lhi, const T &rhi) const {
		return lhi.second < rhi.second;
	}